

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_unpacked_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id,bool register_expression_read)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  Compiler *this_00;
  byte local_5d;
  undefined1 local_50 [45];
  bool is_packed;
  bool is_remapped;
  bool need_transpose;
  SPIRExpression *e;
  bool register_expression_read_local;
  Compiler *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id);
  e._4_4_ = (uint32_t)CONCAT71(in_register_00000011,register_expression_read);
  e._3_1_ = in_CL & 1;
  pCStack_18 = this_00;
  this_local = this;
  register0x00000000 = Compiler::maybe_get<spirv_cross::SPIRExpression>(this_00,e._4_4_);
  local_5d = 0;
  if (register0x00000000 != (SPIRExpression *)0x0) {
    local_5d = register0x00000000->need_transpose;
  }
  local_50[0x27] = local_5d & 1;
  local_50[0x26] =
       Compiler::has_extended_decoration(this_00,e._4_4_,SPIRVCrossDecorationPhysicalTypeID);
  local_50[0x25] =
       Compiler::has_extended_decoration(this_00,e._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
  if (((local_50[0x27] & 1) == 0) && (((local_50[0x26] & 1) != 0 || ((bool)local_50[0x25])))) {
    to_expression_abi_cxx11_((CompilerGLSL *)local_50,id,SUB41(e._4_4_,0));
    uVar2 = Compiler::expression_type_id(this_00,e._4_4_);
    pSVar3 = Compiler::get_pointee_type(this_00,uVar2);
    uVar2 = Compiler::get_extended_decoration(this_00,e._4_4_,SPIRVCrossDecorationPhysicalTypeID);
    bVar1 = Compiler::has_extended_decoration
                      (this_00,e._4_4_,SPIRVCrossDecorationPhysicalTypePacked);
    (*this_00->_vptr_Compiler[0x23])(this,this_00,local_50,pSVar3,(ulong)uVar2,(ulong)bVar1,0);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    to_expression_abi_cxx11_(this,id,SUB41(e._4_4_,0));
  }
  return this;
}

Assistant:

string CompilerGLSL::to_unpacked_expression(uint32_t id, bool register_expression_read)
{
	// If we need to transpose, it will also take care of unpacking rules.
	auto *e = maybe_get<SPIRExpression>(id);
	bool need_transpose = e && e->need_transpose;
	bool is_remapped = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
	bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);

	if (!need_transpose && (is_remapped || is_packed))
	{
		return unpack_expression_type(to_expression(id, register_expression_read),
		                              get_pointee_type(expression_type_id(id)),
		                              get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID),
		                              has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked), false);
	}
	else
		return to_expression(id, register_expression_read);
}